

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateTypeRegistrations
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *this_00;
  MessageGenerator *this_01;
  int local_1c;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  io::Printer::Print(printer,
                     "::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(\n  $classname$_descriptor_, &$classname$::default_instance());\n"
                     ,"classname",&this->classname_);
  local_1c = 0;
  while( true ) {
    iVar1 = Descriptor::nested_type_count(this->descriptor_);
    if (iVar1 <= local_1c) break;
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
              ::operator[](&this->nested_generators_,(long)local_1c);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                        (this_00);
    GenerateTypeRegistrations(this_01,printer);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateTypeRegistrations(io::Printer* printer) {
  // Register this message type with the message factory.
  printer->Print(
    "::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(\n"
    "  $classname$_descriptor_, &$classname$::default_instance());\n",
    "classname", classname_);

  // Handle nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateTypeRegistrations(printer);
  }
}